

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_buffer.cpp
# Opt level: O1

tuple<const_char_*,_long> __thiscall ReadBuffer::get_line(ReadBuffer *this)

{
  ulong uVar1;
  _Head_base<0UL,_const_char_*,_false> in_RDX;
  _Tuple_impl<1UL,_long> in_RDI;
  long lVar2;
  tuple<const_char_*,_long> tVar3;
  tuple<const_char_*,_long> tVar4;
  
  uVar1 = this->left;
  if ((long)(uVar1 + 1) < this->right) {
    in_RDX._M_head_impl = this->buffer;
    lVar2 = 0;
    do {
      if ((in_RDX._M_head_impl[lVar2 + uVar1] == '\r') &&
         (in_RDX._M_head_impl[lVar2 + uVar1 + 1] == '\n')) {
        tVar4.super__Tuple_impl<0UL,_const_char_*,_long>.super__Head_base<0UL,_const_char_*,_false>.
        _M_head_impl = in_RDX._M_head_impl + uVar1;
        this->left = uVar1 + lVar2 + 2;
        *(long *)in_RDI.super__Head_base<1UL,_long,_false>._M_head_impl = lVar2;
        *(char **)((long)in_RDI.super__Head_base<1UL,_long,_false>._M_head_impl + 8) =
             tVar4.super__Tuple_impl<0UL,_const_char_*,_long>.
             super__Head_base<0UL,_const_char_*,_false>._M_head_impl;
        tVar4.super__Tuple_impl<0UL,_const_char_*,_long>.super__Tuple_impl<1UL,_long>.
        super__Head_base<1UL,_long,_false>._M_head_impl =
             in_RDI.super__Head_base<1UL,_long,_false>._M_head_impl;
        return (tuple<const_char_*,_long>)tVar4.super__Tuple_impl<0UL,_const_char_*,_long>;
      }
      lVar2 = lVar2 + 1;
    } while (~uVar1 + this->right != lVar2);
  }
  *(long *)in_RDI.super__Head_base<1UL,_long,_false>._M_head_impl = 0;
  *(long *)((long)in_RDI.super__Head_base<1UL,_long,_false>._M_head_impl + 8) = 0;
  tVar3.super__Tuple_impl<0UL,_const_char_*,_long>.super__Head_base<0UL,_const_char_*,_false>.
  _M_head_impl = in_RDX._M_head_impl;
  tVar3.super__Tuple_impl<0UL,_const_char_*,_long>.super__Tuple_impl<1UL,_long>.
  super__Head_base<1UL,_long,_false>._M_head_impl =
       in_RDI.super__Head_base<1UL,_long,_false>._M_head_impl;
  return (tuple<const_char_*,_long>)tVar3.super__Tuple_impl<0UL,_const_char_*,_long>;
}

Assistant:

std::tuple<const char *, ssize_t> ReadBuffer::get_line() {
    ssize_t i;
    for (i = this->left; i + 1 < this->right; i++) {
        if (this->buffer[i] == '\r' && this->buffer[i + 1] == '\n') {
            auto result = std::make_tuple(this->buffer + this->left, i - this->left);
            this->left = i + 2;
            return result;
        }
    }
    return std::make_tuple(nullptr, 0);
}